

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d.cpp
# Opt level: O2

int __thiscall
ncnn::DeformableConv2D::forward
          (DeformableConv2D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  pointer pMVar12;
  pointer pMVar13;
  Mat *this_00;
  void *pvVar14;
  size_t sVar15;
  void *pvVar16;
  float *pfVar17;
  pointer pMVar18;
  size_t sVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  float *pfVar39;
  float *pfVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  bool bVar44;
  float fVar45;
  float fVar46;
  uint uVar47;
  uint uVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  long local_190;
  int h_in;
  int local_138;
  void *local_130;
  float *local_120;
  
  pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  iVar1 = pMVar12->w;
  iVar2 = pMVar12->h;
  uVar3 = pMVar12->c;
  iVar21 = (~((this->kernel_w + -1) * this->dilation_w) + iVar1 + this->pad_left + this->pad_right)
           / this->stride_w;
  iVar22 = (~((this->kernel_h + -1) * this->dilation_h) + iVar2 + this->pad_top + this->pad_bottom)
           / this->stride_h;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,iVar21 + 1,iVar22 + 1,this->num_output,pMVar12->elemsize,opt->blob_allocator);
  pvVar14 = this_00->data;
  local_138 = -100;
  if ((pvVar14 != (void *)0x0) && (sVar15 = this_00->cstep, (long)this_00->c * sVar15 != 0)) {
    pvVar16 = (this->weight_data).data;
    local_130 = pvVar16;
    if (this->bias_term != 0) {
      local_130 = (this->bias_data).data;
    }
    local_138 = 0;
    uVar27 = 0;
    if (0 < (int)uVar3) {
      uVar27 = (ulong)uVar3;
    }
    for (lVar42 = 0; lVar42 <= iVar22; lVar42 = lVar42 + 1) {
      iVar4 = this->stride_h;
      iVar5 = this->pad_top;
      iVar6 = this->stride_w;
      iVar7 = this->pad_left;
      uVar23 = this->num_output;
      if (this->num_output < 1) {
        uVar23 = 0;
      }
      for (lVar43 = 0; lVar43 <= iVar21; lVar43 = lVar43 + 1) {
        iVar8 = this->bias_term;
        iVar9 = this->activation_type;
        uVar24 = this->kernel_h;
        if (this->kernel_h < 1) {
          uVar24 = 0;
        }
        pfVar17 = (float *)(this->activation_params).data;
        local_190 = 0;
        for (uVar30 = 0; uVar30 != uVar23; uVar30 = uVar30 + 1) {
          if (iVar8 == 0) {
            fVar54 = 0.0;
          }
          else {
            fVar54 = *(float *)((long)local_130 + uVar30 * 4);
          }
          uVar47 = this->kernel_w;
          lVar32 = (long)(int)uVar47;
          pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          iVar10 = this->dilation_w;
          iVar11 = this->dilation_h;
          uVar28 = 0;
          if (0 < (int)uVar47) {
            uVar28 = (ulong)uVar47;
          }
          lVar34 = this->kernel_h * lVar32;
          local_120 = (float *)(lVar34 * local_190 + (long)pvVar16);
          for (uVar31 = 0; uVar31 != uVar24; uVar31 = uVar31 + 1) {
            pfVar39 = local_120;
            for (uVar37 = 0; uVar37 != uVar28; uVar37 = uVar37 + 1) {
              lVar29 = uVar31 * lVar32 + uVar37;
              fVar55 = 1.0;
              if ((long)pMVar13 - (long)pMVar12 == 0xd8) {
                fVar55 = *(float *)((long)pMVar18[2].data +
                                   lVar43 * 4 +
                                   pMVar18[2].w * lVar42 * pMVar18[2].elemsize +
                                   pMVar18[2].cstep * lVar29 * pMVar18[2].elemsize);
              }
              sVar19 = pMVar12[1].elemsize;
              lVar33 = pMVar12[1].w * lVar42 * sVar19;
              fVar49 = (float)(iVar11 * (int)uVar31 + (iVar4 * (int)lVar42 - iVar5)) +
                       *(float *)((long)pMVar12[1].data +
                                 lVar43 * 4 + lVar33 + lVar29 * 2 * pMVar12[1].cstep * sVar19);
              fVar51 = (float)(iVar10 * (int)uVar37 + (iVar6 * (int)lVar43 - iVar7)) +
                       *(float *)((long)pMVar12[1].data +
                                 lVar43 * 4 + lVar33 + sVar19 * pMVar12[1].cstep * (lVar29 * 2 + 1))
              ;
              if ((float)iVar1 <= fVar51 ||
                  (((float)iVar2 <= fVar49 || fVar49 <= -1.0) || fVar51 <= -1.0)) {
                fVar45 = 0.0;
                fVar46 = 0.0;
                fVar58 = 0.0;
                fVar56 = 0.0;
                lVar29 = 0;
                lVar33 = 0;
                lVar38 = 0;
                lVar36 = 0;
                bVar44 = false;
                bVar26 = false;
                bVar25 = false;
                bVar35 = false;
              }
              else {
                fVar45 = floorf(fVar49);
                fVar46 = floorf(fVar51);
                uVar47 = (uint)fVar45;
                uVar48 = (uint)fVar46;
                fVar56 = fVar49 - (float)(int)uVar47;
                fVar57 = fVar51 - (float)(int)uVar48;
                bVar44 = -1 < (int)(uVar47 | uVar48);
                bVar20 = (int)uVar48 < iVar1 + -1;
                bVar26 = -1 < (int)uVar47 && bVar20;
                bVar35 = (int)uVar47 < iVar2 + -1;
                bVar25 = -1 < (int)uVar48 && bVar35;
                bVar35 = bVar35 && bVar20;
                fVar45 = (1.0 - fVar57) * fVar56;
                fVar46 = fVar56 * fVar57;
                fVar58 = fVar57 * (1.0 - fVar56);
                fVar56 = (1.0 - fVar56) * (1.0 - fVar57);
                lVar33 = (long)(int)uVar48;
                lVar36 = (long)(int)(uVar48 + 1);
                lVar29 = (long)(int)uVar47;
                lVar38 = (long)(int)(uVar47 + 1);
              }
              pfVar40 = pfVar39;
              for (uVar41 = 0; uVar27 != uVar41; uVar41 = uVar41 + 1) {
                fVar50 = 0.0;
                fVar57 = 0.0;
                if ((float)iVar1 > fVar51 &&
                    (((float)iVar2 > fVar49 && fVar49 > -1.0) && fVar51 > -1.0)) {
                  fVar50 = 0.0;
                  if (bVar44) {
                    fVar50 = *(float *)((long)pMVar12->data +
                                       lVar33 * 4 +
                                       pMVar12->w * lVar29 * pMVar12->elemsize +
                                       pMVar12->cstep * uVar41 * pMVar12->elemsize);
                  }
                  if (bVar26) {
                    fVar57 = *(float *)((long)pMVar12->data +
                                       lVar36 * 4 +
                                       pMVar12->w * lVar29 * pMVar12->elemsize +
                                       pMVar12->cstep * uVar41 * pMVar12->elemsize);
                  }
                  fVar53 = 0.0;
                  fVar52 = 0.0;
                  if (bVar25) {
                    fVar52 = *(float *)((long)pMVar12->data +
                                       lVar33 * 4 +
                                       pMVar12->w * lVar38 * pMVar12->elemsize +
                                       pMVar12->cstep * uVar41 * pMVar12->elemsize);
                  }
                  if (bVar35) {
                    fVar53 = *(float *)((long)pMVar12->data +
                                       lVar36 * 4 +
                                       pMVar12->w * lVar38 * pMVar12->elemsize +
                                       pMVar12->cstep * uVar41 * pMVar12->elemsize);
                  }
                  fVar50 = fVar50 * fVar56 + fVar53 * fVar46 + fVar57 * fVar58 + fVar52 * fVar45;
                }
                fVar54 = fVar54 + fVar50 * fVar55 * *pfVar40;
                pfVar40 = pfVar40 + lVar34;
              }
              pfVar39 = pfVar39 + 1;
            }
            local_120 = local_120 + lVar32;
          }
          fVar55 = fVar54;
          switch(iVar9) {
          case 1:
            if (fVar54 <= 0.0) {
              fVar55 = 0.0;
            }
            break;
          case 2:
            fVar55 = (float)(~-(uint)(0.0 < fVar54) & (uint)*pfVar17 |
                            -(uint)(0.0 < fVar54) & 0x3f800000) * fVar54;
            break;
          case 3:
            if (fVar54 <= *pfVar17) {
              fVar54 = *pfVar17;
            }
            fVar55 = pfVar17[1];
            if (fVar54 <= pfVar17[1]) {
              fVar55 = fVar54;
            }
            break;
          case 4:
            if (88.37626 <= fVar54) {
              fVar54 = 88.37626;
            }
            fVar54 = expf((float)(-(uint)(fVar54 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar54 < -88.37626) & (uint)-fVar54));
            fVar55 = 1.0 / (fVar54 + 1.0);
            break;
          case 5:
            fVar55 = expf(fVar54);
            fVar55 = logf(fVar55 + 1.0);
            fVar55 = tanhf(fVar55);
            fVar55 = fVar55 * fVar54;
            break;
          case 6:
            fVar49 = *pfVar17;
            fVar51 = -pfVar17[1] / fVar49;
            fVar55 = 0.0;
            if ((fVar51 <= fVar54) && (fVar55 = fVar54, fVar54 <= fVar51 + 1.0 / fVar49)) {
              fVar55 = (fVar49 * fVar54 + pfVar17[1]) * fVar54;
            }
          }
          *(float *)((long)pvVar14 +
                    lVar43 * 4 +
                    this_00->w * lVar42 * this_00->elemsize + sVar15 * uVar30 * this_00->elemsize) =
               fVar55;
          local_190 = local_190 + (long)(int)uVar3 * 4;
        }
      }
    }
  }
  return local_138;
}

Assistant:

int DeformableConv2D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output.shape is [num_output, out_h, out_w] (in python).
    Mat& output = top_blobs[0];
    output.create(out_w, out_h, num_output, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    const float* weight_ptr = weight_data;
    const float* bias_ptr = weight_data;
    if (bias_term)
        bias_ptr = bias_data;

    // deformable conv
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            for (int oc = 0; oc < num_output; oc++)
            {
                float sum = 0.f;
                if (bias_term)
                    sum = bias_ptr[oc];
                for (int i = 0; i < kernel_h; i++)
                {
                    for (int j = 0; j < kernel_w; j++)
                    {
                        const float offset_h = offset.channel((i * kernel_w + j) * 2).row(h_col)[w_col];
                        const float offset_w = offset.channel((i * kernel_w + j) * 2 + 1).row(h_col)[w_col];
                        const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                        const float h_im = h_in + i * dilation_h + offset_h;
                        const float w_im = w_in + j * dilation_w + offset_w;

                        // Bilinear
                        const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                        int h_low = 0;
                        int w_low = 0;
                        int h_high = 0;
                        int w_high = 0;
                        float w1 = 0.f;
                        float w2 = 0.f;
                        float w3 = 0.f;
                        float w4 = 0.f;
                        bool v1_cond = false;
                        bool v2_cond = false;
                        bool v3_cond = false;
                        bool v4_cond = false;
                        if (cond)
                        {
                            h_low = floor(h_im);
                            w_low = floor(w_im);
                            h_high = h_low + 1;
                            w_high = w_low + 1;

                            float lh = h_im - h_low;
                            float lw = w_im - w_low;
                            float hh = 1 - lh;
                            float hw = 1 - lw;

                            v1_cond = (h_low >= 0 && w_low >= 0);
                            v2_cond = (h_low >= 0 && w_high <= w - 1);
                            v3_cond = (h_high <= h - 1 && w_low >= 0);
                            v4_cond = (h_high <= h - 1 && w_high <= w - 1);

                            w1 = hh * hw;
                            w2 = hh * lw;
                            w3 = lh * hw;
                            w4 = lh * lw;
                        }

                        for (int c_im = 0; c_im < in_c; c_im++)
                        {
                            float val = 0.f;
                            if (cond)
                            {
                                float v1 = v1_cond ? bottom_blob.channel(c_im).row(h_low)[w_low] : 0.f;
                                float v2 = v2_cond ? bottom_blob.channel(c_im).row(h_low)[w_high] : 0.f;
                                float v3 = v3_cond ? bottom_blob.channel(c_im).row(h_high)[w_low] : 0.f;
                                float v4 = v4_cond ? bottom_blob.channel(c_im).row(h_high)[w_high] : 0.f;
                                val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                            }
                            sum += val * mask_ * weight_ptr[((oc * in_c + c_im) * kernel_h + i) * kernel_w + j];
                        }
                    }
                }
                output.channel(oc).row(h_col)[w_col] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    return 0;
}